

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O0

void __thiscall CSocekt::initconnection(CSocekt *this)

{
  flyd_connection_s *this_00;
  list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *this_01;
  size_type sVar1;
  AtomicIntegerT<int> *this_02;
  long in_RDI;
  int i;
  int ilenconnpool;
  CMemory *p_memory;
  lp_connection_t p_Conn;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  flyd_connection_s *in_stack_ffffffffffffffc0;
  value_type *in_stack_ffffffffffffffc8;
  undefined4 local_20;
  
  CMemory::GetInstance();
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x6c); local_20 = local_20 + 1) {
    this_00 = (flyd_connection_s *)
              CMemory::AllocMemory
                        ((CMemory *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                         (bool)in_stack_ffffffffffffffbb);
    flyd_connection_s::flyd_connection_s(this_00);
    flyd_connection_s::GetOneToUse(in_stack_ffffffffffffffc0);
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
              ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)this_00,
               in_stack_ffffffffffffffc8);
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
              ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)this_00,
               in_stack_ffffffffffffffc8);
  }
  this_01 = (list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)(in_RDI + 0xac);
  sVar1 = std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::size
                    (this_01);
  muduo::detail::AtomicIntegerT<int>::getAndSet((AtomicIntegerT<int> *)this_01,(int)sVar1);
  this_02 = (AtomicIntegerT<int> *)(in_RDI + 0xa8);
  sVar1 = std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::size
                    (this_01);
  muduo::detail::AtomicIntegerT<int>::getAndSet(this_02,(int)sVar1);
  return;
}

Assistant:

void CSocekt::initconnection()
{
    lp_connection_t p_Conn;
    CMemory *p_memory = CMemory::GetInstance();   

    int ilenconnpool = sizeof(flyd_connection_t);    
    for(int i = 0; i < m_worker_connections; ++i) //先创建这么多个连接，后续不够再增加
    {
        p_Conn = (lp_connection_t)p_memory->AllocMemory(ilenconnpool,true); //清理内存 , 因为这里分配内存new char，无法执行构造函数，所以如下：
        //手工调用构造函数，因为AllocMemory里无法调用构造函数
        //定位new就是先分配了内存，再把地址p_Conn交给flyd_connection_t
        p_Conn = new(p_Conn) flyd_connection_t();  //定位new【不懂请百度】，释放则显式调用p_Conn->~ngx_connection_t();		
        p_Conn->GetOneToUse();
        m_connectionList.push_back(p_Conn);     //所有链接【不管是否空闲】都放在这个list
        m_freeconnectionList.push_back(p_Conn); //空闲连接会放在这个list
    } //end for
    m_free_connection_n.getAndSet(m_connectionList.size());
    m_total_connection_n.getAndSet(m_connectionList.size());
    return;
}